

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall Assimp::PretransformVertices::Execute(PretransformVertices *this,aiScene *pScene)

{
  pointer *this_00;
  uint uVar1;
  uint iVFormat;
  aiBone *this_01;
  aiAnimation *this_02;
  undefined1 auVar2 [16];
  uint pcMeshOut [2];
  aiScene *paVar3;
  bool bVar4;
  ai_uint32 aVar5;
  Logger *pLVar6;
  size_type sVar7;
  ulong uVar8;
  aiMesh **__dest;
  reference ppaVar9;
  reference pvVar10;
  reference puVar11;
  aiMesh *paVar12;
  uint (*pauVar13) [2];
  ulong *puVar14;
  aiVector3t<float> *paVar15;
  aiColor4t<float> *paVar16;
  DeadlyImportError *this_03;
  aiNode *this_04;
  uint *puVar17;
  aiNode *paVar18;
  float *pfVar19;
  aiVector3D *paVar20;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar21;
  basic_formatter *pbVar22;
  aiFace *paVar23;
  aiVector3t<float> aVar24;
  aiColor4t<float> *local_a68;
  aiVector3t<float> *local_a40;
  aiVector3t<float> *local_a18;
  aiVector3t<float> *local_9f0;
  aiVector3t<float> *local_9c8;
  aiVector3t<float> *local_9a0;
  aiFace *local_978;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  string local_760;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  string local_5c8;
  uint local_5a4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_428;
  undefined8 local_408;
  float local_400;
  aiVector3t<float> local_3f8;
  aiVector3t<float> local_3e8;
  undefined8 local_3d8;
  float local_3d0;
  uint local_3cc;
  aiMesh *paStack_3c8;
  uint i_12;
  aiMesh *m_1;
  undefined8 uStack_3b8;
  uint a_3;
  float local_3b0;
  aiVector3t<float> local_3a8;
  aiVector3t<float> local_398;
  aiVector3t<float> local_388;
  float local_37c;
  undefined8 uStack_378;
  ai_real div;
  float local_370;
  undefined1 local_368 [8];
  aiVector3D d;
  uint local_31c;
  uint i_11;
  aiMesh *m;
  MinMaxChooser<aiVector3t<float>_> local_305;
  uint a_2;
  aiVector3D max;
  aiVector3D min;
  aiNode *pcNode_2;
  uint i_10;
  aiNode *pcNode_1;
  uint i_9;
  aiNode *pcNode;
  aiNode **ppaStack_2b8;
  uint i_8;
  aiNode **nodes;
  aiNode *newRoot;
  aiMatrix3x3t<float> local_298;
  undefined8 local_274;
  float local_26c;
  undefined8 local_268;
  float local_260;
  aiMatrix3x3t<float> local_254;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  float local_208;
  aiNode *local_200;
  aiNode *nd_1;
  aiLight *l;
  undefined8 uStack_1e8;
  uint i_7;
  float local_1e0;
  aiMatrix3x3t<float> local_1d8;
  undefined8 local_1b4;
  float local_1ac;
  undefined8 local_1a8;
  float local_1a0;
  aiMatrix3x3t<float> local_194;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  aiNode *local_140;
  aiNode *nd;
  aiCamera *cam;
  uint i_6;
  uint i_5;
  uint i_4;
  uint a_1;
  aiMesh *mesh_1;
  uint i_3;
  uint local_f0 [2];
  uint aiTemp [2];
  aiMesh *pcMesh;
  uint local_d8;
  uint local_d4;
  uint iFaces;
  uint iVertices;
  _List_const_iterator<unsigned_int> local_c8;
  iterator local_c0;
  _List_const_iterator<unsigned_int> local_b8;
  const_iterator j;
  allocator<unsigned_int> local_a5;
  uint i_2;
  undefined1 local_a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> s;
  list<unsigned_int,_std::allocator<unsigned_int>_> aiVFormats;
  uint i_1;
  aiMesh **npp;
  undefined1 local_50 [8];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcOutMeshes;
  uint a;
  aiMesh *mesh;
  uint i;
  uint iOldNodes;
  uint iOldAnimationChannels;
  uint iOldMeshes;
  aiScene *pScene_local;
  PretransformVertices *this_local;
  
  _iOldAnimationChannels = pScene;
  pScene_local = (aiScene *)this;
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"PretransformVerticesProcess begin");
  if (_iOldAnimationChannels->mNumMeshes != 0) {
    iOldNodes = _iOldAnimationChannels->mNumMeshes;
    i = _iOldAnimationChannels->mNumAnimations;
    mesh._4_4_ = CountNodes(this,_iOldAnimationChannels->mRootNode);
    if ((this->configTransform & 1U) != 0) {
      memcpy(&_iOldAnimationChannels->mRootNode->mTransformation,&this->configTransformation,0x40);
    }
    ComputeAbsoluteTransform(this,_iOldAnimationChannels->mRootNode);
    for (mesh._0_4_ = 0; (uint)mesh < _iOldAnimationChannels->mNumMeshes;
        mesh._0_4_ = (uint)mesh + 1) {
      paVar12 = _iOldAnimationChannels->mMeshes[(uint)mesh];
      for (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < paVar12->mNumBones;
          apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        this_01 = paVar12->mBones
                  [apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_];
        if (this_01 != (aiBone *)0x0) {
          aiBone::~aiBone(this_01);
          operator_delete(this_01);
        }
      }
      if (paVar12->mBones != (aiBone **)0x0) {
        operator_delete__(paVar12->mBones);
      }
      paVar12->mBones = (aiBone **)0x0;
    }
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
    if ((this->configKeepHierarchy & 1U) == 0) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50,
                 (ulong)(_iOldAnimationChannels->mNumMaterials * 2));
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      uVar1 = _iOldAnimationChannels->mNumMeshes;
      i_2 = 0;
      std::allocator<unsigned_int>::allocator(&local_a5);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,(ulong)uVar1,&i_2,
                 &local_a5);
      std::allocator<unsigned_int>::~allocator(&local_a5);
      paVar18 = _iOldAnimationChannels->mRootNode;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,0);
      BuildMeshRefCountArray(this,paVar18,pvVar10);
      for (j._M_node._4_4_ = 0; j._M_node._4_4_ < _iOldAnimationChannels->mNumMaterials;
          j._M_node._4_4_ = j._M_node._4_4_ + 1) {
        this_00 = &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
        GetVFormatList(this,_iOldAnimationChannels,j._M_node._4_4_,
                       (list<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::sort
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::unique
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        local_c0._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_b8,&local_c0);
        while( true ) {
          _iFaces = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::_List_const_iterator<unsigned_int>::_List_const_iterator
                    (&local_c8,(iterator *)&iFaces);
          bVar4 = std::operator!=(&local_b8,&local_c8);
          paVar3 = _iOldAnimationChannels;
          uVar1 = j._M_node._4_4_;
          if (!bVar4) break;
          local_d4 = 0;
          local_d8 = 0;
          paVar18 = _iOldAnimationChannels->mRootNode;
          puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8);
          CountVerticesAndFaces(this,paVar3,paVar18,uVar1,*puVar11,&local_d8,&local_d4);
          if ((local_d8 != 0) && (local_d4 != 0)) {
            paVar12 = (aiMesh *)operator_new(0x520);
            aiMesh::aiMesh(paVar12);
            pcMesh = paVar12;
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50,&pcMesh);
            pauVar13 = (uint (*) [2])
                       std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                                 ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
            aiTemp = *pauVar13;
            *(uint *)((long)aiTemp + 8) = local_d8;
            *(uint *)((long)aiTemp + 4) = local_d4;
            uVar8 = (ulong)local_d8;
            puVar14 = (ulong *)operator_new__(uVar8 << 4 | 8);
            *puVar14 = uVar8;
            paVar23 = (aiFace *)(puVar14 + 1);
            if (uVar8 != 0) {
              local_978 = paVar23;
              do {
                aiFace::aiFace(local_978);
                local_978 = local_978 + 1;
              } while (local_978 != paVar23 + uVar8);
            }
            *(aiFace **)((long)aiTemp + 0xd0) = paVar23;
            uVar8 = (ulong)local_d4;
            paVar15 = (aiVector3t<float> *)operator_new__(uVar8 * 0xc);
            if (uVar8 != 0) {
              local_9a0 = paVar15;
              do {
                aiVector3t<float>::aiVector3t(local_9a0);
                local_9a0 = local_9a0 + 1;
              } while (local_9a0 != paVar15 + uVar8);
            }
            *(aiVector3t<float> **)((long)aiTemp + 0x10) = paVar15;
            *(uint *)((long)aiTemp + 0xe8) = j._M_node._4_4_;
            puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8);
            if ((*puVar11 & 2) != 0) {
              uVar8 = (ulong)local_d4;
              paVar15 = (aiVector3t<float> *)operator_new__(uVar8 * 0xc);
              if (uVar8 != 0) {
                local_9c8 = paVar15;
                do {
                  aiVector3t<float>::aiVector3t(local_9c8);
                  local_9c8 = local_9c8 + 1;
                } while (local_9c8 != paVar15 + uVar8);
              }
              *(aiVector3t<float> **)((long)aiTemp + 0x18) = paVar15;
            }
            puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8);
            if ((*puVar11 & 4) != 0) {
              uVar8 = (ulong)local_d4;
              paVar15 = (aiVector3t<float> *)operator_new__(uVar8 * 0xc);
              if (uVar8 != 0) {
                local_9f0 = paVar15;
                do {
                  aiVector3t<float>::aiVector3t(local_9f0);
                  local_9f0 = local_9f0 + 1;
                } while (local_9f0 != paVar15 + uVar8);
              }
              *(aiVector3t<float> **)((long)aiTemp + 0x20) = paVar15;
              uVar8 = (ulong)local_d4;
              paVar15 = (aiVector3t<float> *)operator_new__(uVar8 * 0xc);
              if (uVar8 != 0) {
                local_a18 = paVar15;
                do {
                  aiVector3t<float>::aiVector3t(local_a18);
                  local_a18 = local_a18 + 1;
                } while (local_a18 != paVar15 + uVar8);
              }
              *(aiVector3t<float> **)((long)aiTemp + 0x28) = paVar15;
            }
            local_d8 = 0;
            while (puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8),
                  (*puVar11 & 0x100 << ((byte)local_d8 & 0x1f)) != 0) {
              uVar8 = (ulong)local_d4;
              paVar15 = (aiVector3t<float> *)operator_new__(uVar8 * 0xc);
              if (uVar8 != 0) {
                local_a40 = paVar15;
                do {
                  aiVector3t<float>::aiVector3t(local_a40);
                  local_a40 = local_a40 + 1;
                } while (local_a40 != paVar15 + uVar8);
              }
              *(aiVector3t<float> **)((long)aiTemp + 0x70 + (ulong)local_d8 * 8) = paVar15;
              puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8);
              if ((*puVar11 & 0x10000 << ((byte)local_d8 & 0x1f)) == 0) {
                *(undefined4 *)((long)aiTemp + 0xb0 + (ulong)local_d8 * 4) = 2;
              }
              else {
                *(undefined4 *)((long)aiTemp + 0xb0 + (ulong)local_d8 * 4) = 3;
              }
              local_d8 = local_d8 + 1;
            }
            local_d8 = 0;
            while (puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8),
                  paVar3 = _iOldAnimationChannels, uVar1 = j._M_node._4_4_,
                  (*puVar11 & 0x1000000 << ((byte)local_d8 & 0x1f)) != 0) {
              uVar8 = (ulong)local_d4;
              paVar16 = (aiColor4t<float> *)operator_new__(uVar8 << 4);
              if (uVar8 != 0) {
                local_a68 = paVar16;
                do {
                  aiColor4t<float>::aiColor4t(local_a68);
                  local_a68 = local_a68 + 1;
                } while (local_a68 != paVar16 + uVar8);
              }
              *(aiColor4t<float> **)((long)aiTemp + 0x30 + (ulong)local_d8 * 8) = paVar16;
              local_d8 = local_d8 + 1;
            }
            local_f0[0] = 0;
            local_f0[1] = 0;
            paVar18 = _iOldAnimationChannels->mRootNode;
            puVar11 = std::_List_const_iterator<unsigned_int>::operator*(&local_b8);
            pcMeshOut = aiTemp;
            iVFormat = *puVar11;
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,0);
            CollectData(this,paVar3,paVar18,uVar1,iVFormat,(aiMesh *)pcMeshOut,local_f0,pvVar10);
          }
          std::_List_const_iterator<unsigned_int>::operator++(&local_b8);
        }
      }
      bVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
      if (bVar4) {
        mesh_1._6_1_ = 1;
        this_03 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&i_3,
                   "No output meshes: all meshes are orphaned and are not referenced by any nodes",
                   (allocator *)((long)&mesh_1 + 7));
        DeadlyImportError::DeadlyImportError(this_03,(string *)&i_3);
        mesh_1._6_1_ = 0;
        __cxa_throw(this_03,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      for (mesh_1._0_4_ = 0; (uint)mesh_1 < _iOldAnimationChannels->mNumMeshes;
          mesh_1._0_4_ = (uint)mesh_1 + 1) {
        paVar12 = _iOldAnimationChannels->mMeshes[(uint)mesh_1];
        paVar12->mNumBones = 0;
        paVar12->mBones = (aiBone **)0x0;
        for (i_5 = 0; i_5 < paVar12->mNumFaces; i_5 = i_5 + 1) {
          paVar12->mFaces[i_5].mNumIndices = 0;
          paVar12->mFaces[i_5].mIndices = (uint *)0x0;
        }
        if (paVar12 != (aiMesh *)0x0) {
          _i_4 = paVar12;
          aiMesh::~aiMesh(paVar12);
          operator_delete(paVar12);
        }
        _i_4 = (aiMesh *)0x0;
      }
      sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
      _iOldAnimationChannels->mNumMeshes = (uint)sVar7;
      for (i_6 = 0; i_6 < _iOldAnimationChannels->mNumMeshes; i_6 = i_6 + 1) {
        ppaVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50,(ulong)i_6);
        _iOldAnimationChannels->mMeshes[i_6] = *ppaVar9;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      BuildWCSMeshes(this,(vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50,
                     _iOldAnimationChannels->mMeshes,_iOldAnimationChannels->mNumMeshes,
                     _iOldAnimationChannels->mRootNode);
      sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
      if (sVar7 != 0) {
        uVar1 = _iOldAnimationChannels->mNumMeshes;
        sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar1 + sVar7;
        uVar8 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        __dest = (aiMesh **)operator_new__(uVar8);
        memcpy(__dest,_iOldAnimationChannels->mMeshes,(ulong)_iOldAnimationChannels->mNumMeshes << 3
              );
        uVar1 = _iOldAnimationChannels->mNumMeshes;
        ppaVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50,0);
        sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
        memcpy(__dest + uVar1,ppaVar9,sVar7 << 3);
        sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
        _iOldAnimationChannels->mNumMeshes = (int)sVar7 + _iOldAnimationChannels->mNumMeshes;
        if (_iOldAnimationChannels->mMeshes != (aiMesh **)0x0) {
          operator_delete__(_iOldAnimationChannels->mMeshes);
        }
        _iOldAnimationChannels->mMeshes = __dest;
      }
      for (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           _M_size._4_4_ = 0;
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          _M_size._4_4_ < _iOldAnimationChannels->mNumMeshes;
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          _M_size._4_4_ =
               aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               _M_node._M_size._4_4_ + 1) {
        ApplyTransform(this,_iOldAnimationChannels->mMeshes
                            [aiVFormats.
                             super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                             _M_node._M_size._4_4_],
                       (aiMatrix4x4 *)
                       _iOldAnimationChannels->mMeshes
                       [aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node._M_size._4_4_]->mBones);
        _iOldAnimationChannels->mMeshes
        [aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
         _M_size._4_4_]->mBones = (aiBone **)0x0;
        _iOldAnimationChannels->mMeshes
        [aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
         _M_size._4_4_]->mNumBones = 0;
      }
    }
    for (cam._4_4_ = 0; cam._4_4_ < _iOldAnimationChannels->mNumAnimations;
        cam._4_4_ = cam._4_4_ + 1) {
      this_02 = _iOldAnimationChannels->mAnimations[cam._4_4_];
      if (this_02 != (aiAnimation *)0x0) {
        aiAnimation::~aiAnimation(this_02);
        operator_delete(this_02);
      }
    }
    if (_iOldAnimationChannels->mAnimations != (aiAnimation **)0x0) {
      operator_delete__(_iOldAnimationChannels->mAnimations);
    }
    _iOldAnimationChannels->mAnimations = (aiAnimation **)0x0;
    _iOldAnimationChannels->mNumAnimations = 0;
    for (cam._0_4_ = 0; (uint)cam < _iOldAnimationChannels->mNumCameras; cam._0_4_ = (uint)cam + 1)
    {
      nd = (aiNode *)_iOldAnimationChannels->mCameras[(uint)cam];
      local_140 = aiNode::FindNode(_iOldAnimationChannels->mRootNode,(aiString *)nd);
      if (local_140 == (aiNode *)0x0) {
        __assert_fail("__null != nd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                      ,0x265,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
      }
      aVar24 = ::operator*(&local_140->mTransformation,(aiVector3t<float> *)&nd->mTransformation);
      local_158 = aVar24.z;
      local_160 = aVar24._0_8_;
      (nd->mTransformation).a3 = local_158;
      (nd->mTransformation).a1 = (float)(int)local_160;
      (nd->mTransformation).a2 = (float)(int)((ulong)local_160 >> 0x20);
      local_150 = local_160;
      local_148 = local_158;
      aiMatrix3x3t<float>::aiMatrix3x3t(&local_194,&local_140->mTransformation);
      aVar24 = ::operator*(&local_194,(aiVector3t<float> *)&(nd->mTransformation).b3);
      local_1a0 = aVar24.z;
      local_1a8 = aVar24._0_8_;
      (nd->mTransformation).c1 = local_1a0;
      (nd->mTransformation).b3 = (float)(int)local_1a8;
      (nd->mTransformation).b4 = (float)(int)((ulong)local_1a8 >> 0x20);
      local_170 = local_1a8;
      local_168 = local_1a0;
      aiMatrix3x3t<float>::aiMatrix3x3t(&local_1d8,&local_140->mTransformation);
      aVar24 = ::operator*(&local_1d8,(aiVector3t<float> *)&(nd->mTransformation).a4);
      local_1e0 = aVar24.z;
      uStack_1e8 = aVar24._0_8_;
      (nd->mTransformation).a4 = (float)(int)uStack_1e8;
      (nd->mTransformation).b1 = (float)(int)((ulong)uStack_1e8 >> 0x20);
      (nd->mTransformation).b2 = local_1e0;
      local_1b4 = uStack_1e8;
      local_1ac = local_1e0;
    }
    for (l._4_4_ = 0; l._4_4_ < _iOldAnimationChannels->mNumLights; l._4_4_ = l._4_4_ + 1) {
      nd_1 = (aiNode *)_iOldAnimationChannels->mLights[l._4_4_];
      local_200 = aiNode::FindNode(_iOldAnimationChannels->mRootNode,(aiString *)nd_1);
      if (local_200 == (aiNode *)0x0) {
        __assert_fail("__null != nd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                      ,0x272,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
      }
      aVar24 = ::operator*(&local_200->mTransformation,
                           (aiVector3t<float> *)&(nd_1->mTransformation).a2);
      local_218 = aVar24.z;
      local_220 = aVar24._0_8_;
      (nd_1->mTransformation).a4 = local_218;
      (nd_1->mTransformation).a2 = (float)(int)local_220;
      (nd_1->mTransformation).a3 = (float)(int)((ulong)local_220 >> 0x20);
      local_210 = local_220;
      local_208 = local_218;
      aiMatrix3x3t<float>::aiMatrix3x3t(&local_254,&local_200->mTransformation);
      aVar24 = ::operator*(&local_254,(aiVector3t<float> *)&(nd_1->mTransformation).b1);
      local_260 = aVar24.z;
      local_268 = aVar24._0_8_;
      (nd_1->mTransformation).b3 = local_260;
      (nd_1->mTransformation).b1 = (float)(int)local_268;
      (nd_1->mTransformation).b2 = (float)(int)((ulong)local_268 >> 0x20);
      local_230 = local_268;
      local_228 = local_260;
      aiMatrix3x3t<float>::aiMatrix3x3t(&local_298,&local_200->mTransformation);
      aVar24 = ::operator*(&local_298,(aiVector3t<float> *)&(nd_1->mTransformation).b4);
      local_26c = aVar24.z;
      local_274 = aVar24._0_8_;
      (nd_1->mTransformation).b4 = (float)(int)local_274;
      (nd_1->mTransformation).c1 = (float)(int)((ulong)local_274 >> 0x20);
      (nd_1->mTransformation).c2 = local_26c;
    }
    if ((this->configKeepHierarchy & 1U) == 0) {
      this_04 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_04);
      aiString::operator=((aiString *)this_04,&_iOldAnimationChannels->mRootNode->mName);
      paVar18 = _iOldAnimationChannels->mRootNode;
      if (paVar18 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar18);
        operator_delete(paVar18);
      }
      _iOldAnimationChannels->mRootNode = this_04;
      if (((_iOldAnimationChannels->mNumMeshes == 1) && (_iOldAnimationChannels->mNumLights == 0))
         && (_iOldAnimationChannels->mNumCameras == 0)) {
        _iOldAnimationChannels->mRootNode->mNumMeshes = 1;
        puVar17 = (uint *)operator_new__(4);
        _iOldAnimationChannels->mRootNode->mMeshes = puVar17;
        *_iOldAnimationChannels->mRootNode->mMeshes = 0;
      }
      else {
        _iOldAnimationChannels->mRootNode->mNumChildren =
             _iOldAnimationChannels->mNumMeshes + _iOldAnimationChannels->mNumLights +
             _iOldAnimationChannels->mNumCameras;
        ppaStack_2b8 = (aiNode **)
                       operator_new__((ulong)_iOldAnimationChannels->mRootNode->mNumChildren << 3);
        _iOldAnimationChannels->mRootNode->mChildren = ppaStack_2b8;
        for (pcNode._4_4_ = 0; pcNode._4_4_ < _iOldAnimationChannels->mNumMeshes;
            pcNode._4_4_ = pcNode._4_4_ + 1) {
          paVar18 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar18);
          *ppaStack_2b8 = paVar18;
          paVar18->mParent = _iOldAnimationChannels->mRootNode;
          aiString::operator=((aiString *)paVar18,
                              &_iOldAnimationChannels->mMeshes[pcNode._4_4_]->mName);
          paVar18->mNumMeshes = 1;
          puVar17 = (uint *)operator_new__(4);
          paVar18->mMeshes = puVar17;
          *paVar18->mMeshes = pcNode._4_4_;
          ppaStack_2b8 = ppaStack_2b8 + 1;
        }
        for (pcNode_1._4_4_ = 0; pcNode_1._4_4_ < _iOldAnimationChannels->mNumLights;
            pcNode_1._4_4_ = pcNode_1._4_4_ + 1) {
          paVar18 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar18);
          *ppaStack_2b8 = paVar18;
          paVar18->mParent = _iOldAnimationChannels->mRootNode;
          aVar5 = snprintf((paVar18->mName).data,0x400,"light_%u",(ulong)pcNode_1._4_4_);
          (paVar18->mName).length = aVar5;
          aiString::operator=(&_iOldAnimationChannels->mLights[pcNode_1._4_4_]->mName,
                              (aiString *)paVar18);
          ppaStack_2b8 = ppaStack_2b8 + 1;
        }
        for (pcNode_2._4_4_ = 0; pcNode_2._4_4_ < _iOldAnimationChannels->mNumCameras;
            pcNode_2._4_4_ = pcNode_2._4_4_ + 1) {
          paVar18 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar18);
          *ppaStack_2b8 = paVar18;
          paVar18->mParent = _iOldAnimationChannels->mRootNode;
          aVar5 = snprintf((paVar18->mName).data,0x400,"cam_%u",(ulong)pcNode_2._4_4_);
          (paVar18->mName).length = aVar5;
          aiString::operator=(&_iOldAnimationChannels->mCameras[pcNode_2._4_4_]->mName,
                              (aiString *)paVar18);
          ppaStack_2b8 = ppaStack_2b8 + 1;
        }
      }
    }
    else {
      MakeIdentityTransform(this,_iOldAnimationChannels->mRootNode);
    }
    if ((this->configNormalize & 1U) != 0) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&max.y);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&a_2);
      MinMaxChooser<aiVector3t<float>_>::operator()
                (&local_305,(aiVector3t<float> *)&max.y,(aiVector3t<float> *)&a_2);
      for (m._4_4_ = 0; m._4_4_ < _iOldAnimationChannels->mNumMeshes; m._4_4_ = m._4_4_ + 1) {
        paVar12 = _iOldAnimationChannels->mMeshes[m._4_4_];
        for (local_31c = 0; local_31c < paVar12->mNumVertices; local_31c = local_31c + 1) {
          aVar24 = std::min<float>(paVar12->mVertices + local_31c,(aiVector3t<float> *)&max.y);
          max._4_8_ = aVar24._0_8_;
          aVar24 = std::max<float>(paVar12->mVertices + local_31c,(aiVector3t<float> *)&a_2);
          max.x = aVar24.z;
          unique0x100006e5 = aVar24._0_8_;
          _a_2 = unique0x100006e5;
        }
      }
      aVar24 = ::operator-((aiVector3t<float> *)&a_2,(aiVector3t<float> *)&max.y);
      local_370 = aVar24.z;
      uStack_378 = aVar24._0_8_;
      local_368 = (undefined1  [8])uStack_378;
      d.x = local_370;
      pfVar19 = std::max<float>((float *)(local_368 + 4),&d.x);
      pfVar19 = std::max<float>((float *)local_368,pfVar19);
      local_37c = *pfVar19 * 0.5;
      aVar24 = ::operator*((aiVector3t<float> *)local_368,0.5);
      local_3a8.z = aVar24.z;
      local_3a8._0_8_ = aVar24._0_8_;
      local_398._0_8_ = local_3a8._0_8_;
      local_398.z = local_3a8.z;
      aVar24 = ::operator+((aiVector3t<float> *)&max.y,&local_398);
      local_3b0 = aVar24.z;
      uStack_3b8 = aVar24._0_8_;
      local_388._0_8_ = uStack_3b8;
      local_388.z = local_3b0;
      local_368 = (undefined1  [8])uStack_3b8;
      d.x = local_3b0;
      for (m_1._4_4_ = 0; m_1._4_4_ < _iOldAnimationChannels->mNumMeshes; m_1._4_4_ = m_1._4_4_ + 1)
      {
        paStack_3c8 = _iOldAnimationChannels->mMeshes[m_1._4_4_];
        for (local_3cc = 0; local_3cc < paStack_3c8->mNumVertices; local_3cc = local_3cc + 1) {
          aVar24 = ::operator-(paStack_3c8->mVertices + local_3cc,(aiVector3t<float> *)local_368);
          local_3f8.z = aVar24.z;
          local_3f8._0_8_ = aVar24._0_8_;
          local_3e8._0_8_ = local_3f8._0_8_;
          local_3e8.z = local_3f8.z;
          aVar24 = operator/(&local_3e8,local_37c);
          local_400 = aVar24.z;
          local_408 = aVar24._0_8_;
          paVar20 = paStack_3c8->mVertices + local_3cc;
          paVar20->x = (float)(int)local_408;
          paVar20->y = (float)(int)((ulong)local_408 >> 0x20);
          paVar20->z = local_400;
          local_3d8 = local_408;
          local_3d0 = local_400;
        }
      }
    }
    bVar4 = DefaultLogger::isNullLogger();
    if (!bVar4) {
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"PretransformVerticesProcess finished");
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[9]>(&local_5a0,(char (*) [9])0x2c0bb2);
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_5a0,(uint *)((long)&mesh + 4));
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [12])" nodes and ");
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,&i);
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [22])" animation channels (");
      local_5a4 = CountNodes(this,_iOldAnimationChannels->mRootNode);
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,&local_5a4);
      pbVar22 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [15])" output nodes)");
      Formatter::basic_formatter::operator_cast_to_string(&local_428,pbVar22);
      Logger::info(pLVar6,&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_5a0);
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[6]>(&local_740,(char (*) [6])"Kept ");
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_740,&_iOldAnimationChannels->mNumLights);
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [13])" lights and ");
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,&_iOldAnimationChannels->mNumCameras);
      pbVar22 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [10])" cameras.");
      Formatter::basic_formatter::operator_cast_to_string(&local_5c8,pbVar22);
      Logger::info(pLVar6,&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_740);
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>(&local_8d8,(char (*) [7])"Moved ");
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_8d8,&iOldNodes);
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [42])" meshes to WCS (number of output meshes: ");
      pbVar21 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,&_iOldAnimationChannels->mNumMeshes);
      pbVar22 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar21,(char (*) [2])0x2c30df);
      Formatter::basic_formatter::operator_cast_to_string(&local_760,pbVar22);
      Logger::info(pLVar6,&local_760);
      std::__cxx11::string::~string((string *)&local_760);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_8d8);
    }
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_50);
  }
  return;
}

Assistant:

void PretransformVertices::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("PretransformVerticesProcess begin");

    // Return immediately if we have no meshes
    if (!pScene->mNumMeshes)
        return;

    const unsigned int iOldMeshes = pScene->mNumMeshes;
    const unsigned int iOldAnimationChannels = pScene->mNumAnimations;
    const unsigned int iOldNodes = CountNodes(pScene->mRootNode);

    if(configTransform) {
        pScene->mRootNode->mTransformation = configTransformation;
    }

    // first compute absolute transformation matrices for all nodes
    ComputeAbsoluteTransform(pScene->mRootNode);

    // Delete aiMesh::mBones for all meshes. The bones are
    // removed during this step and we need the pointer as
    // temporary storage
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        aiMesh* mesh = pScene->mMeshes[i];

        for (unsigned int a = 0; a < mesh->mNumBones;++a)
            delete mesh->mBones[a];

        delete[] mesh->mBones;
        mesh->mBones = NULL;
    }

    // now build a list of output meshes
    std::vector<aiMesh*> apcOutMeshes;

    // Keep scene hierarchy? It's an easy job in this case ...
    // we go on and transform all meshes, if one is referenced by nodes
    // with different absolute transformations a depth copy of the mesh
    // is required.
    if( configKeepHierarchy ) {

        // Hack: store the matrix we're transforming a mesh with in aiMesh::mBones
        BuildWCSMeshes(apcOutMeshes,pScene->mMeshes,pScene->mNumMeshes, pScene->mRootNode);

        // ... if new meshes have been generated, append them to the end of the scene
        if (apcOutMeshes.size() > 0) {
            aiMesh** npp = new aiMesh*[pScene->mNumMeshes + apcOutMeshes.size()];

            memcpy(npp,pScene->mMeshes,sizeof(aiMesh*)*pScene->mNumMeshes);
            memcpy(npp+pScene->mNumMeshes,&apcOutMeshes[0],sizeof(aiMesh*)*apcOutMeshes.size());

            pScene->mNumMeshes  += static_cast<unsigned int>(apcOutMeshes.size());
            delete[] pScene->mMeshes; pScene->mMeshes = npp;
        }

        // now iterate through all meshes and transform them to worldspace
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            ApplyTransform(pScene->mMeshes[i],*reinterpret_cast<aiMatrix4x4*>( pScene->mMeshes[i]->mBones ));

            // prevent improper destruction
            pScene->mMeshes[i]->mBones    = NULL;
            pScene->mMeshes[i]->mNumBones = 0;
        }
    } else {
        apcOutMeshes.reserve(pScene->mNumMaterials<<1u);
        std::list<unsigned int> aiVFormats;

        std::vector<unsigned int> s(pScene->mNumMeshes,0);
        BuildMeshRefCountArray(pScene->mRootNode,&s[0]);

        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)     {
            // get the list of all vertex formats for this material
            aiVFormats.clear();
            GetVFormatList(pScene,i,aiVFormats);
            aiVFormats.sort();
            aiVFormats.unique();
            for (std::list<unsigned int>::const_iterator j =  aiVFormats.begin();j != aiVFormats.end();++j) {
                unsigned int iVertices = 0;
                unsigned int iFaces = 0;
                CountVerticesAndFaces(pScene,pScene->mRootNode,i,*j,&iFaces,&iVertices);
                if (0 != iFaces && 0 != iVertices)
                {
                    apcOutMeshes.push_back(new aiMesh());
                    aiMesh* pcMesh = apcOutMeshes.back();
                    pcMesh->mNumFaces = iFaces;
                    pcMesh->mNumVertices = iVertices;
                    pcMesh->mFaces = new aiFace[iFaces];
                    pcMesh->mVertices = new aiVector3D[iVertices];
                    pcMesh->mMaterialIndex = i;
                    if ((*j) & 0x2)pcMesh->mNormals = new aiVector3D[iVertices];
                    if ((*j) & 0x4)
                    {
                        pcMesh->mTangents    = new aiVector3D[iVertices];
                        pcMesh->mBitangents  = new aiVector3D[iVertices];
                    }
                    iFaces = 0;
                    while ((*j) & (0x100 << iFaces))
                    {
                        pcMesh->mTextureCoords[iFaces] = new aiVector3D[iVertices];
                        if ((*j) & (0x10000 << iFaces))pcMesh->mNumUVComponents[iFaces] = 3;
                        else pcMesh->mNumUVComponents[iFaces] = 2;
                        iFaces++;
                    }
                    iFaces = 0;
                    while ((*j) & (0x1000000 << iFaces))
                        pcMesh->mColors[iFaces++] = new aiColor4D[iVertices];

                    // fill the mesh ...
                    unsigned int aiTemp[2] = {0,0};
                    CollectData(pScene,pScene->mRootNode,i,*j,pcMesh,aiTemp,&s[0]);
                }
            }
        }

        // If no meshes are referenced in the node graph it is possible that we get no output meshes.
        if (apcOutMeshes.empty()) {
            
            throw DeadlyImportError("No output meshes: all meshes are orphaned and are not referenced by any nodes");
        }
        else
        {
            // now delete all meshes in the scene and build a new mesh list
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
            {
                aiMesh* mesh = pScene->mMeshes[i];
                mesh->mNumBones = 0;
                mesh->mBones    = NULL;

                // we're reusing the face index arrays. avoid destruction
                for (unsigned int a = 0; a < mesh->mNumFaces; ++a) {
                    mesh->mFaces[a].mNumIndices = 0;
                    mesh->mFaces[a].mIndices = NULL;
                }

                delete mesh;

                // Invalidate the contents of the old mesh array. We will most
                // likely have less output meshes now, so the last entries of
                // the mesh array are not overridden. We set them to NULL to
                // make sure the developer gets notified when his application
                // attempts to access these fields ...
                mesh = NULL;
            }

            // It is impossible that we have more output meshes than
            // input meshes, so we can easily reuse the old mesh array
            pScene->mNumMeshes = (unsigned int)apcOutMeshes.size();
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
                pScene->mMeshes[i] = apcOutMeshes[i];
            }
        }
    }

    // remove all animations from the scene
    for (unsigned int i = 0; i < pScene->mNumAnimations;++i)
        delete pScene->mAnimations[i];
    delete[] pScene->mAnimations;

    pScene->mAnimations    = NULL;
    pScene->mNumAnimations = 0;

    // --- we need to keep all cameras and lights
    for (unsigned int i = 0; i < pScene->mNumCameras;++i)
    {
        aiCamera* cam = pScene->mCameras[i];
        const aiNode* nd = pScene->mRootNode->FindNode(cam->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        cam->mPosition = nd->mTransformation * cam->mPosition;
        cam->mLookAt   = aiMatrix3x3( nd->mTransformation ) * cam->mLookAt;
        cam->mUp       = aiMatrix3x3( nd->mTransformation ) * cam->mUp;
    }

    for (unsigned int i = 0; i < pScene->mNumLights;++i)
    {
        aiLight* l = pScene->mLights[i];
        const aiNode* nd = pScene->mRootNode->FindNode(l->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        l->mPosition   = nd->mTransformation * l->mPosition;
        l->mDirection  = aiMatrix3x3( nd->mTransformation ) * l->mDirection;
        l->mUp         = aiMatrix3x3( nd->mTransformation ) * l->mUp;
    }

    if( !configKeepHierarchy ) {

        // now delete all nodes in the scene and build a new
        // flat node graph with a root node and some level 1 children
        aiNode* newRoot = new aiNode();
        newRoot->mName = pScene->mRootNode->mName;
        delete pScene->mRootNode;
        pScene->mRootNode = newRoot;

        if (1 == pScene->mNumMeshes && !pScene->mNumLights && !pScene->mNumCameras)
        {
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
        else
        {
            pScene->mRootNode->mNumChildren = pScene->mNumMeshes+pScene->mNumLights+pScene->mNumCameras;
            aiNode** nodes = pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];

            // generate mesh nodes
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName = pScene->mMeshes[i]->mName;

                // setup mesh indices
                pcNode->mNumMeshes = 1;
                pcNode->mMeshes = new unsigned int[1];
                pcNode->mMeshes[0] = i;
            }
            // generate light nodes
            for (unsigned int i = 0; i < pScene->mNumLights;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "light_%u",i);
                pScene->mLights[i]->mName = pcNode->mName;
            }
            // generate camera nodes
            for (unsigned int i = 0; i < pScene->mNumCameras;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ::ai_snprintf(pcNode->mName.data,MAXLEN,"cam_%u",i);
                pScene->mCameras[i]->mName = pcNode->mName;
            }
        }
    }
    else {
        // ... and finally set the transformation matrix of all nodes to identity
        MakeIdentityTransform(pScene->mRootNode);
    }

    if (configNormalize) {
        // compute the boundary of all meshes
        aiVector3D min,max;
        MinMaxChooser<aiVector3D> ()(min,max);

        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                min = std::min(m->mVertices[i],min);
                max = std::max(m->mVertices[i],max);
            }
        }

        // find the dominant axis
        aiVector3D d = max-min;
        const ai_real div = std::max(d.x,std::max(d.y,d.z))*ai_real( 0.5);

        d = min + d * (ai_real)0.5;
        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                m->mVertices[i] = (m->mVertices[i]-d)/div;
            }
        }
    }

    // print statistics
    if (!DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_DEBUG("PretransformVerticesProcess finished");

        ASSIMP_LOG_INFO_F("Removed ", iOldNodes, " nodes and ", iOldAnimationChannels, " animation channels (", 
            CountNodes(pScene->mRootNode) ," output nodes)" );
        ASSIMP_LOG_INFO_F("Kept ", pScene->mNumLights, " lights and ", pScene->mNumCameras, " cameras." );
        ASSIMP_LOG_INFO_F("Moved ", iOldMeshes, " meshes to WCS (number of output meshes: ", pScene->mNumMeshes, ")");
    }
}